

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void sub8x8_adjust_offset(CFL_CTX *cfl,int mi_row,int mi_col,int *row_out,int *col_out)

{
  int *col_out_local;
  int *row_out_local;
  int mi_col_local;
  int mi_row_local;
  CFL_CTX *cfl_local;
  
  if (((mi_row & 1U) != 0) && (cfl->subsampling_y != 0)) {
    *row_out = *row_out + 1;
  }
  if (((mi_col & 1U) != 0) && (cfl->subsampling_x != 0)) {
    *col_out = *col_out + 1;
  }
  return;
}

Assistant:

static inline void sub8x8_adjust_offset(const CFL_CTX *cfl, int mi_row,
                                        int mi_col, int *row_out,
                                        int *col_out) {
  // Increment row index for bottom: 8x4, 16x4 or both bottom 4x4s.
  if ((mi_row & 0x01) && cfl->subsampling_y) {
    assert(*row_out == 0);
    (*row_out)++;
  }

  // Increment col index for right: 4x8, 4x16 or both right 4x4s.
  if ((mi_col & 0x01) && cfl->subsampling_x) {
    assert(*col_out == 0);
    (*col_out)++;
  }
}